

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlOutputJson.c
# Opt level: O2

JL_STATUS OutputNumberObject(JlDataObject *NumberObject,JlBuffer *JsonBuffer,
                            JL_OUTPUT_FLAGS OutputFlags,uint32_t StackDepth)

{
  JL_NUM_TYPE JVar1;
  JL_STATUS JVar2;
  size_t DataSize;
  char *__format;
  uint64_t numU64;
  char numString [64];
  
  numString[0x30] = '\0';
  numString[0x31] = '\0';
  numString[0x32] = '\0';
  numString[0x33] = '\0';
  numString[0x34] = '\0';
  numString[0x35] = '\0';
  numString[0x36] = '\0';
  numString[0x37] = '\0';
  numString[0x38] = '\0';
  numString[0x39] = '\0';
  numString[0x3a] = '\0';
  numString[0x3b] = '\0';
  numString[0x3c] = '\0';
  numString[0x3d] = '\0';
  numString[0x3e] = '\0';
  numString[0x3f] = '\0';
  numString[0x20] = '\0';
  numString[0x21] = '\0';
  numString[0x22] = '\0';
  numString[0x23] = '\0';
  numString[0x24] = '\0';
  numString[0x25] = '\0';
  numString[0x26] = '\0';
  numString[0x27] = '\0';
  numString[0x28] = '\0';
  numString[0x29] = '\0';
  numString[0x2a] = '\0';
  numString[0x2b] = '\0';
  numString[0x2c] = '\0';
  numString[0x2d] = '\0';
  numString[0x2e] = '\0';
  numString[0x2f] = '\0';
  numString[0x10] = '\0';
  numString[0x11] = '\0';
  numString[0x12] = '\0';
  numString[0x13] = '\0';
  numString[0x14] = '\0';
  numString[0x15] = '\0';
  numString[0x16] = '\0';
  numString[0x17] = '\0';
  numString[0x18] = '\0';
  numString[0x19] = '\0';
  numString[0x1a] = '\0';
  numString[0x1b] = '\0';
  numString[0x1c] = '\0';
  numString[0x1d] = '\0';
  numString[0x1e] = '\0';
  numString[0x1f] = '\0';
  numString[0] = '\0';
  numString[1] = '\0';
  numString[2] = '\0';
  numString[3] = '\0';
  numString[4] = '\0';
  numString[5] = '\0';
  numString[6] = '\0';
  numString[7] = '\0';
  numString[8] = '\0';
  numString[9] = '\0';
  numString[10] = '\0';
  numString[0xb] = '\0';
  numString[0xc] = '\0';
  numString[0xd] = '\0';
  numString[0xe] = '\0';
  numString[0xf] = '\0';
  JVar1 = JlGetObjectNumberType(NumberObject);
  if (JVar1 == JL_NUM_TYPE_FLOAT) {
    numU64 = 0;
    JVar2 = JlGetObjectNumberF64(NumberObject,(double *)&numU64);
    if (JVar2 == JL_STATUS_SUCCESS) {
      sprintf(numString,"%.16g",(int)numU64);
    }
  }
  else {
    if (JVar1 == JL_NUM_TYPE_SIGNED) {
      numU64 = 0;
      JVar2 = JlGetObjectNumberS64(NumberObject,(int64_t *)&numU64);
      if (JVar2 != JL_STATUS_SUCCESS) goto LAB_00119f07;
      __format = "%ld";
    }
    else {
      if (JVar1 != JL_NUM_TYPE_UNSIGNED) {
        return JL_STATUS_WRONG_TYPE;
      }
      numU64 = 0;
      JVar2 = JlGetObjectNumberU64(NumberObject,&numU64);
      if (JVar2 != JL_STATUS_SUCCESS) goto LAB_00119f07;
      if (((OutputFlags & 0x20) == 0) ||
         (JVar1 = JlIsObjectNumberHex(NumberObject), JVar1 == JL_NUM_TYPE_NONE)) {
        __format = "%lu";
      }
      else if (numU64 < 0x100) {
        __format = "0x%2.2lx";
      }
      else if (numU64 < 0x10000) {
        __format = "0x%4.4lx";
      }
      else if (numU64 >> 0x20 == 0) {
        __format = "0x%8.8lx";
      }
      else {
        __format = "0x%16.16lx";
      }
    }
    sprintf(numString,__format,numU64);
  }
LAB_00119f07:
  if (JVar2 == JL_STATUS_SUCCESS) {
    DataSize = strlen(numString);
    JVar2 = JlBufferAdd(JsonBuffer,numString,DataSize);
  }
  return JVar2;
}

Assistant:

JL_STATUS
    OutputNumberObject
    (
        JlDataObject const*     NumberObject,
        JlBuffer*               JsonBuffer,
        JL_OUTPUT_FLAGS         OutputFlags,
        uint32_t                StackDepth
    )
{
    JL_STATUS jlStatus;
    char numString [64] = "";

    JL_NUM_TYPE numType = JlGetObjectNumberType( NumberObject );
    if( JL_NUM_TYPE_UNSIGNED == numType )
    {
        uint64_t numU64 = 0;
        jlStatus = JlGetObjectNumberU64( NumberObject, &numU64 );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            if(     OutputFlags & JL_OUTPUT_FLAGS_J5_ALLOW_HEX
                &&  JlIsObjectNumberHex( NumberObject ) )
            {
                // Format hex as 2 digits, 4 digits, 8 digits, or 16 digits depending on value
                if     ( numU64 <= 0xff )       { sprintf( numString, "0x%2.2"PRIx64, numU64 ); }
                else if( numU64 <= 0xffff )     { sprintf( numString, "0x%4.4"PRIx64, numU64 ); }
                else if( numU64 <= 0xffffffff ) { sprintf( numString, "0x%8.8"PRIx64, numU64 ); }
                else                            { sprintf( numString, "0x%16.16"PRIx64, numU64 ); }
            }
            else
            {
                sprintf( numString, "%"PRIu64, numU64 );
            }
        }
    }
    else if( JL_NUM_TYPE_SIGNED == numType )
    {
        int64_t numS64 = 0;
        jlStatus = JlGetObjectNumberS64( NumberObject, &numS64 );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            sprintf( numString, "%"PRId64, numS64 );
        }
    }
    else if( JL_NUM_TYPE_FLOAT == numType )
    {
        // Now try getting as a double
        double numF64 = 0.0;
        jlStatus = JlGetObjectNumberF64( NumberObject, &numF64 );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            // Note: Output is printing using %.16g which gives the best compromise between precision and sensibly
            // printing out most numbers. While %.17g would give full precision it will cause simple numbers such
            // as 2.1 to print as 2.1000000000000001 due to the limitations of the floating point format.
            sprintf( numString, "%.16g", numF64 );
        }
    }
    else
    {
        jlStatus = JL_STATUS_WRONG_TYPE;
    }

    if( JL_STATUS_SUCCESS == jlStatus )
    {
        jlStatus = JlBufferAdd( JsonBuffer, numString, strlen(numString) );
    }

    return jlStatus;
}